

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execNbcd<(moira::Instr)82,(moira::Mode)7,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 in_stack_00000008;
  u32 in_stack_0000000c;
  u32 data;
  u32 ea;
  int reg;
  u32 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar1 = readOp<(moira::Mode)7,(moira::Size)1,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  if (bVar1) {
    prefetch<0ul>(in_RDI);
    bcd<(moira::Instr)100,(moira::Size)1>(_data,in_stack_0000000c,in_stack_00000008);
    writeM<(moira::Mode)7,(moira::Size)1,4ul>
              (in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
Moira::execNbcd(u16 opcode)
{
    int reg = _____________xxx(opcode);

    switch (M) {

        case 0: // Dn
        {
            prefetch<POLLIPL>();

            sync(2);
            writeD<Byte>(reg, bcd<SBCD, Byte>(readD<Byte>(reg), 0));
            break;
        }
        default: // Ea
        {
            u32 ea, data;
            if (!readOp<M, Byte>(reg, ea, data)) return;
            prefetch();
            writeM<M, Byte, POLLIPL>(ea, bcd <SBCD,Byte> (data, 0));
            break;
        }
    }
}